

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O0

EC_T_DWORD RasNotifyWrapper(EC_T_DWORD dwCode,EC_T_NOTIFYPARMS *pParms)

{
  CEmNotification *pNotInst;
  EC_T_DWORD dwRetVal;
  EC_T_NOTIFYPARMS *pParms_local;
  EC_T_DWORD dwCode_local;
  
  if ((pParms == (EC_T_NOTIFYPARMS *)0x0) || (pParms->pCallerData == (void *)0x0)) {
    pNotInst._4_4_ = 0x9811000b;
  }
  else {
    pNotInst._4_4_ =
         CEmNotification::emRasNotify((CEmNotification *)pParms->pCallerData,dwCode,pParms);
  }
  return pNotInst._4_4_;
}

Assistant:

static EC_T_DWORD RasNotifyWrapper(
                            EC_T_DWORD         dwCode, 
                            EC_T_NOTIFYPARMS*  pParms
                            )
{
    EC_T_DWORD                      dwRetVal                = EC_E_NOERROR;
    CEmNotification*                pNotInst                = EC_NULL;
    
    if ((EC_NULL == pParms)||(EC_NULL==pParms->pCallerData))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }
    
    pNotInst = (CEmNotification*)(pParms->pCallerData);
    dwRetVal = pNotInst->emRasNotify(dwCode, pParms);
Exit:
    
    return dwRetVal;
}